

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  ImGuiPayload *pIVar2;
  size_t sVar3;
  bool local_3d;
  bool local_3b;
  ImGuiPayload *payload;
  ImGuiContext *g;
  ImGuiCond cond_local;
  size_t data_size_local;
  void *data_local;
  char *type_local;
  
  pIVar1 = GImGui;
  pIVar2 = &GImGui->DragDropPayload;
  g._4_4_ = cond;
  if (cond == 0) {
    g._4_4_ = 1;
  }
  if (type == (char *)0x0) {
    __assert_fail("type != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x2e13,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  sVar3 = strlen(type);
  if (0x20 < sVar3) {
    __assert_fail("strlen(type) < ((int)(sizeof(payload.DataType) / sizeof(*(payload.DataType)))) && \"Payload type can be at most 32 characters long\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x2e14,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((data == (void *)0x0) || (local_3b = true, data_size == 0)) {
    local_3b = data == (void *)0x0 && data_size == 0;
  }
  if (local_3b) {
    if (g._4_4_ != 1 && g._4_4_ != 2) {
      __assert_fail("cond == ImGuiCond_Always || cond == ImGuiCond_Once",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x2e16,
                    "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)")
      ;
    }
    if ((pIVar1->DragDropPayload).SourceId == 0) {
      __assert_fail("payload.SourceId != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x2e17,
                    "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)")
      ;
    }
    if ((g._4_4_ == 1) || ((pIVar1->DragDropPayload).DataFrameCount == -1)) {
      ImStrncpy((pIVar1->DragDropPayload).DataType,type,0x21);
      ImVector<unsigned_char>::resize(&pIVar1->DragDropPayloadBufHeap,0);
      if (data_size < 0x11) {
        if (data_size == 0) {
          pIVar2->Data = (void *)0x0;
        }
        else {
          memset(pIVar1->DragDropPayloadBufLocal,0,0x10);
          pIVar2->Data = pIVar1->DragDropPayloadBufLocal;
          memcpy(pIVar2->Data,data,data_size);
        }
      }
      else {
        ImVector<unsigned_char>::resize(&pIVar1->DragDropPayloadBufHeap,(int)data_size);
        pIVar2->Data = (pIVar1->DragDropPayloadBufHeap).Data;
        memcpy(pIVar2->Data,data,data_size);
      }
      (pIVar1->DragDropPayload).DataSize = (int)data_size;
    }
    (pIVar1->DragDropPayload).DataFrameCount = pIVar1->FrameCount;
    local_3d = true;
    if (pIVar1->DragDropAcceptFrameCount != pIVar1->FrameCount) {
      local_3d = pIVar1->DragDropAcceptFrameCount == pIVar1->FrameCount + -1;
    }
    return local_3d;
  }
  __assert_fail("(data != __null && data_size > 0) || (data == __null && data_size == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x2e15,
                "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    // Return whether the payload has been accepted
    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}